

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_get_chrm(spng_ctx *ctx,spng_chrm *chrm)

{
  int iVar1;
  
  iVar1 = 1;
  if ((((ctx != (spng_ctx *)0x0) && (iVar1 = read_chunks(ctx,0), iVar1 == 0)) &&
      (iVar1 = 0x49, ((uint)ctx->stored & 4) != 0)) && (iVar1 = 1, chrm != (spng_chrm *)0x0)) {
    chrm->white_point_x = (double)(ctx->chrm_int).white_point_x / 100000.0;
    chrm->white_point_y = (double)(ctx->chrm_int).white_point_y / 100000.0;
    chrm->red_x = (double)(ctx->chrm_int).red_x / 100000.0;
    chrm->red_y = (double)(ctx->chrm_int).red_y / 100000.0;
    chrm->blue_y = (double)(ctx->chrm_int).blue_y / 100000.0;
    chrm->blue_x = (double)(ctx->chrm_int).blue_x / 100000.0;
    chrm->green_x = (double)(ctx->chrm_int).green_x / 100000.0;
    chrm->green_y = (double)(ctx->chrm_int).green_y / 100000.0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int spng_get_chrm(spng_ctx *ctx, struct spng_chrm *chrm)
{
    SPNG_GET_CHUNK_BOILERPLATE(chrm);

    chrm->white_point_x = (double)ctx->chrm_int.white_point_x / 100000.0;
    chrm->white_point_y = (double)ctx->chrm_int.white_point_y / 100000.0;
    chrm->red_x = (double)ctx->chrm_int.red_x / 100000.0;
    chrm->red_y = (double)ctx->chrm_int.red_y / 100000.0;
    chrm->blue_y = (double)ctx->chrm_int.blue_y / 100000.0;
    chrm->blue_x = (double)ctx->chrm_int.blue_x / 100000.0;
    chrm->green_x = (double)ctx->chrm_int.green_x / 100000.0;
    chrm->green_y = (double)ctx->chrm_int.green_y / 100000.0;

    return 0;
}